

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_layer_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Layer *layer,uint32_t indent)

{
  char *pcVar1;
  long lVar2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  iterator iVar6;
  uint32_t n;
  long lVar7;
  long *plVar8;
  PrimSpec *primspec;
  ulong uVar9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  primNameTable;
  token nameTok;
  stringstream meta_ss;
  stringstream ss;
  undefined1 local_3b8 [32];
  _Base_ptr local_398;
  size_t local_390;
  string *local_388;
  undefined1 local_380 [32];
  string local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  primspec = (PrimSpec *)((ulong)layer & 0xffffffff);
  local_388 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_((string *)local_340,(pprint *)primspec,n);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"#usda 1.0\n",10);
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  print_layer_metas_abi_cxx11_
            ((string *)local_3b8,this + 0x58,(LayerMetas *)(ulong)((int)layer + 1),indent);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_340 + 0x10),(char *)local_3b8._0_8_,
             CONCAT44(local_3b8._12_4_,local_3b8._8_4_));
  pcVar1 = local_3b8 + 0x10;
  if ((char *)local_3b8._0_8_ != pcVar1) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
  }
  ::std::__cxx11::stringbuf::str();
  lVar7 = CONCAT44(local_3b8._12_4_,local_3b8._8_4_);
  if ((char *)local_3b8._0_8_ != pcVar1) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
  }
  if (lVar7 != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
    ::std::__cxx11::stringbuf::str();
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_3b8._0_8_,CONCAT44(local_3b8._12_4_,local_3b8._8_4_));
    if ((char *)local_3b8._0_8_ != pcVar1) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")\n",2);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  lVar5 = *(long *)(this + 0x1568);
  lVar7 = *(long *)(this + 0x1570);
  if (lVar7 - lVar5 >> 5 == *(long *)(this + 0x38)) {
    local_3b8._24_8_ = local_3b8 + 8;
    local_3b8._8_4_ = _S_red;
    local_3b8._16_8_ = (_Link_type)0x0;
    local_390 = 0;
    plVar8 = *(long **)(this + 0x30);
    local_398 = (_Base_ptr)local_3b8._24_8_;
    if (plVar8 != (long *)0x0) {
      do {
        local_380._0_8_ = plVar8 + 5;
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec_const*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                    *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 1)
                   ,(PrimSpec **)local_380);
        plVar8 = (long *)*plVar8;
      } while (plVar8 != (long *)0x0);
      lVar5 = *(long *)(this + 0x1568);
      lVar7 = *(long *)(this + 0x1570);
    }
    if (lVar7 != lVar5) {
      lVar7 = 8;
      uVar9 = 0;
      do {
        lVar2 = *(long *)(lVar5 + -8 + lVar7);
        local_380._0_8_ = (PrimSpec *)(local_380 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,lVar2,*(long *)(lVar5 + lVar7) + lVar2);
        iVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                        *)local_3b8,(key_type *)local_380);
        if (iVar6._M_node != (_Base_ptr)(local_3b8 + 8)) {
          prim::print_primspec_abi_cxx11_
                    (&local_360,*(prim **)(iVar6._M_node + 2),primspec,
                     (uint32_t)(_Base_ptr)(local_3b8 + 8));
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p,local_360.field_2._0_8_ + 1);
          }
          if (uVar9 != (*(long *)(this + 0x1570) - *(long *)(this + 0x1568) >> 5) - 1U) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          }
        }
        if ((PrimSpec *)local_380._0_8_ != (PrimSpec *)(local_380 + 0x10)) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
        }
        uVar9 = uVar9 + 1;
        lVar5 = *(long *)(this + 0x1568);
        lVar7 = lVar7 + 0x20;
      } while (uVar9 < (ulong)(*(long *)(this + 0x1570) - lVar5 >> 5));
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                *)local_3b8,(_Link_type)local_3b8._16_8_);
  }
  else {
    plVar8 = *(long **)(this + 0x30);
    if (plVar8 != (long *)0x0) {
      do {
        prim::print_primspec_abi_cxx11_
                  ((string *)local_3b8,(prim *)(plVar8 + 5),primspec,(uint32_t)lVar7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_3b8._0_8_,CONCAT44(local_3b8._12_4_,local_3b8._8_4_));
        if ((char *)local_3b8._0_8_ != pcVar1) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
        }
        if (*(long *)(this + 0x38) != 1) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
        }
        plVar8 = (long *)*plVar8;
      } while (plVar8 != (long *)0x0);
    }
  }
  psVar3 = local_388;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  ::std::ios_base::~ios_base(aiStack_2c0);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(aiStack_138);
  return psVar3;
}

Assistant:

std::string print_layer(const Layer &layer, const uint32_t indent) {
  std::stringstream ss;

  // FIXME: print magic-header outside of this function?
  ss << pprint::Indent(indent) << "#usda 1.0\n";

  std::stringstream meta_ss;
  meta_ss << print_layer_metas(layer.metas(), indent + 1);

  if (meta_ss.str().size()) {
    ss << "(\n";
    ss << meta_ss.str();
    ss << ")\n";
  }

  ss << "\n";

  if (layer.metas().primChildren.size() == layer.primspecs().size()) {
    std::map<std::string, const PrimSpec *> primNameTable;
    for (const auto &item : layer.primspecs()) {
      primNameTable.emplace(item.first, &item.second);
    }

    for (size_t i = 0; i < layer.metas().primChildren.size(); i++) {
      value::token nameTok = layer.metas().primChildren[i];
      // DCOUT(fmt::format("primChildren  {}/{} = {}", i,
      //                   layer.metas().primChildren.size(), nameTok.str()));
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        ss << prim::print_primspec((*it->second), indent);
        if (i != (layer.metas().primChildren.size() - 1)) {
          ss << "\n";
        }
      } else {
        // TODO: Report warning?
      }
    }
  } else {
    size_t i = 0;
    for (const auto &item : layer.primspecs()) {
      ss << prim::print_primspec(item.second, indent);
      if (i != (layer.primspecs().size() - 1)) {
        ss << "\n";
      }
    }
  }

  return ss.str();
}